

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_applyScaledObj<double>
          (SoPlexBase<double> *this,SPxSolverBase<double> *solver,Rational *dualScale,
          SolRational *sol)

{
  int iVar1;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar2;
  type_conflict5 tVar3;
  RangeType *pRVar4;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_RSI;
  SoPlexBase<double> *in_RDI;
  Rational newRowObj;
  int r;
  int c;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffee0;
  double local_d8;
  Real local_d0;
  Real local_c8 [3];
  undefined8 local_b0;
  undefined1 local_a8 [76];
  int local_5c;
  double local_58;
  Real local_50;
  Real local_48;
  int local_3c;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_28;
  undefined1 *local_18;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_10;
  undefined1 *local_8;
  
  local_28 = in_RSI;
  local_3c = numColsRational((SoPlexBase<double> *)0x4340b9);
  while (local_3c = local_3c + -1, -1 < local_3c) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    tVar3 = boost::multiprecision::operator>=
                      (in_stack_fffffffffffffeb8,
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)0x4340fa);
    pnVar2 = local_28;
    iVar1 = local_3c;
    if (tVar3) {
      local_48 = realParam(in_RDI,INFTY);
      (**(code **)((pnVar2->m_backend).m_value.num.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_data.la[0] + 0x120))(pnVar2,iVar1,&local_48);
    }
    else {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      tVar3 = boost::multiprecision::operator<=
                        (in_stack_fffffffffffffeb8,
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x43417d);
      pnVar2 = local_28;
      iVar1 = local_3c;
      if (tVar3) {
        local_50 = realParam(in_RDI,INFTY);
        local_50 = -local_50;
        (**(code **)((pnVar2->m_backend).m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] + 0x120))(pnVar2,iVar1,&local_50);
      }
      else {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        local_58 = boost::multiprecision::number::operator_cast_to_double
                             ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)0x434220);
        (**(code **)((pnVar2->m_backend).m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] + 0x120))(pnVar2,iVar1,&local_58);
      }
    }
  }
  local_5c = numRowsRational((SoPlexBase<double> *)0x434269);
  while (local_5c = local_5c + -1, -1 < local_5c) {
    local_18 = local_a8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x43429e);
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_rowTypes,local_5c);
    if (*pRVar4 == RANGETYPE_FIXED) {
      local_b0 = 0;
      (**(code **)((local_28->m_backend).m_value.num.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_data.la[0] + 0x1e0))(local_28,local_5c,&local_b0,0);
    }
    else {
      local_10 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_8 = local_a8;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  &in_stack_fffffffffffffeb8->m_backend);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::operator*=(in_stack_fffffffffffffee0,
                   (self_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      tVar3 = boost::multiprecision::operator>=
                        (in_stack_fffffffffffffeb8,
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x43438f);
      iVar1 = local_5c;
      if (tVar3) {
        in_stack_fffffffffffffee0 = local_28;
        local_c8[0] = realParam(in_RDI,INFTY);
        local_c8[0] = -local_c8[0];
        (**(code **)((in_stack_fffffffffffffee0->m_backend).m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] + 0x1e0))(in_stack_fffffffffffffee0,iVar1,local_c8,0);
      }
      else {
        tVar3 = boost::multiprecision::operator<=
                          (in_stack_fffffffffffffeb8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x434416);
        pnVar2 = local_28;
        in_stack_fffffffffffffedc = CONCAT13(tVar3,(int3)in_stack_fffffffffffffedc);
        if (tVar3) {
          in_stack_fffffffffffffed8 = local_5c;
          local_d0 = realParam(in_RDI,INFTY);
          (**(code **)((pnVar2->m_backend).m_value.num.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] + 0x1e0))(pnVar2,in_stack_fffffffffffffed8,&local_d0,0);
        }
        else {
          in_stack_fffffffffffffeb8 = local_28;
          in_stack_fffffffffffffec4 = local_5c;
          local_d8 = boost::multiprecision::number::operator_cast_to_double
                               ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)0x434497);
          local_d8 = -local_d8;
          (**(code **)((in_stack_fffffffffffffeb8->m_backend).m_value.num.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] + 0x1e0))
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffec4,&local_d8,0);
        }
      }
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4344e6);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_applyScaledObj(SPxSolverBase<T>& solver, Rational& dualScale, SolRational& sol)
{
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_modObj[c] >= _rationalPosInfty)
         solver.changeObj(c, realParam(SoPlexBase<R>::INFTY));
      else if(_modObj[c] <= _rationalNegInfty)
         solver.changeObj(c, -realParam(SoPlexBase<R>::INFTY));
      else
         solver.changeObj(c, T(_modObj[c]));
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      Rational newRowObj;

      if(_rowTypes[r] == RANGETYPE_FIXED)
         solver.changeRowObj(r, T(0.0));
      else
      {
         newRowObj = sol._dual[r];
         newRowObj *= dualScale;

         if(newRowObj >= _rationalPosInfty)
            solver.changeRowObj(r, -realParam(SoPlexBase<R>::INFTY));
         else if(newRowObj <= _rationalNegInfty)
            solver.changeRowObj(r, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeRowObj(r, -T(newRowObj));
      }
   }
}